

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<unsigned_int> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<unsigned_int>
          (optional<unsigned_int> *__return_storage_ptr__,PrimVar *this)

{
  optional<unsigned_int> in_RAX;
  optional<unsigned_int> local_18;
  
  local_18 = in_RAX;
  get_value<unsigned_int>(&local_18,this);
  __return_storage_ptr__->has_value_ = local_18.has_value_;
  if (local_18.has_value_ == true) {
    __return_storage_ptr__->contained = local_18.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }